

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O3

void easm_del_directive(easm_directive *directive)

{
  long lVar1;
  
  if (directive != (easm_directive *)0x0) {
    if (0 < directive->paramsnum) {
      lVar1 = 0;
      do {
        easm_del_expr(directive->params[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < directive->paramsnum);
    }
    free(directive->params);
    free(directive->str);
    free(directive);
    return;
  }
  return;
}

Assistant:

void easm_del_directive(struct easm_directive *directive) {
	if (!directive) return;
	int i;
	for (i = 0; i < directive->paramsnum; i++)
		easm_del_expr(directive->params[i]);
	free(directive->params);
	free(directive->str);
	free(directive);
}